

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadReckoningCalculator.h
# Opt level: O0

Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> * __thiscall
KDIS::UTILS::Matrix<float,_(unsigned_char)'\x03',_(unsigned_char)'\x03'>::operator*
          (Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> *__return_storage_ptr__,
          Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> *this,
          Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> *Value)

{
  ushort local_2a;
  ushort local_28;
  ushort local_26;
  KUINT16 k;
  KUINT16 j;
  KUINT16 i;
  float sum;
  float tmp2;
  float tmp;
  Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> *Value_local;
  Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> *this_local;
  
  memcpy(__return_storage_ptr__,this,0x24);
  for (local_26 = 0; local_26 < 3; local_26 = local_26 + 1) {
    for (local_28 = 0; sum = 0.0, local_28 < 3; local_28 = local_28 + 1) {
      for (local_2a = 0; local_2a < 3; local_2a = local_2a + 1) {
        sum = __return_storage_ptr__->Data[local_26][local_2a] * Value->Data[local_2a][local_28] +
              sum;
      }
      __return_storage_ptr__->Data[local_26][local_28] = sum;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix operator * ( const Matrix & Value )
    {
        Matrix m = *this;
        Type tmp = 0,
             tmp2 = 0,
             sum = 0;

        for( KUINT16 i = 0; i < rows; ++i )
        {
            for( KUINT16 j = 0; j < cols; ++j )
            {
                for( KUINT16 k = 0; k < cols; ++k )
                {
                    tmp += m.Data[i][k] * Value.Data[k][j];
                }

                m.Data[i][j] = tmp;
                tmp = 0;
            }
        }

        return m;
    }